

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

namespace_t * __thiscall cs_impl::any::holder<cs::pointer>::get_ext(holder<cs::pointer> *this)

{
  namespace_t *pnVar1;
  
  pnVar1 = get_ext<cs::pointer>();
  return pnVar1;
}

Assistant:

virtual cs::namespace_t &get_ext() const override
			{
				return cs_impl::get_ext<T>();
			}